

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::FillHelper
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  ulong uVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  TypedArrayBase *pTVar7;
  RecyclableObject *aValue;
  Var pvVar8;
  ulong initIndex;
  uint64 uVar9;
  uint64 uVar10;
  int64 i_1;
  int64 i;
  ulong uVar11;
  double dVar12;
  undefined1 local_88 [8];
  BigIndex dstIndex;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  
  local_70 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_70)->noJsReentrancy;
  ((ThreadContext *)local_70)->noJsReentrancy = true;
  jsReentLock._24_8_ = length;
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,pArr);
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x250b,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar4) goto LAB_00b8f8a8;
    *puVar6 = 0;
  }
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pTVar7 = typedArrayBase;
  if ((pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) &&
     (bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj), bVar4)) {
    pTVar7 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
  }
  if (((ulong)args->Info & 0xfffffe) == 0) {
    aValue = (pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    aValue = (RecyclableObject *)Arguments::operator[](args,1);
    if (typedArrayBase != (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar4) goto LAB_00b8f8a8;
        *puVar6 = 0;
      }
      if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        dVar12 = (double)(int)aValue;
      }
      else if ((ulong)aValue >> 0x32 == 0) {
        dVar12 = JavascriptConversion::ToNumber_Full(aValue,scriptContext);
      }
      else {
        dVar12 = (double)((ulong)aValue ^ 0xfffc000000000000);
      }
      aValue = (RecyclableObject *)JavascriptNumber::ToVarNoCheck(dVar12,scriptContext);
    }
  }
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    initIndex = 0;
  }
  else {
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pvVar8 = Arguments::operator[](args,2);
    initIndex = GetIndexFromVar(pvVar8,jsReentLock._24_8_,scriptContext);
    if (((ulong)args->Info & 0xfffffc) != 0) {
      pvVar8 = Arguments::operator[](args,3);
      BVar5 = JavascriptOperators::IsUndefinedObject(pvVar8);
      if (BVar5 == 0) {
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar8 = Arguments::operator[](args,3);
        jsReentLock._24_8_ = GetIndexFromVar(pvVar8,jsReentLock._24_8_,scriptContext);
      }
    }
    if (pArr != (JavascriptArray *)0x0) {
      bVar4 = IsNonES5Array(obj);
      if (bVar4) goto LAB_00b8f4c9;
      bVar4 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2535,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar4) {
LAB_00b8f8a8:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
    pArr = (JavascriptArray *)0x0;
  }
LAB_00b8f4c9:
  if ((long)initIndex < 0xffffffff) {
    uVar11 = 0xffffffff;
    if ((long)jsReentLock._24_8_ < 0xffffffff) {
      uVar11 = jsReentLock._24_8_;
    }
    uVar3 = initIndex & 0xffffffff;
    while ((long)uVar3 < (long)uVar11) {
      if (pTVar7 == (TypedArrayBase *)0x0) {
        if (pArr == (JavascriptArray *)0x0) {
          ((ThreadContext *)local_70)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
          JavascriptOperators::OP_SetElementI_UInt32
                    (obj,(uint32)initIndex,aValue,scriptContext,
                     PropertyOperation_ThrowIfNotExtensible);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          goto LAB_00b8f51f;
        }
        (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (pArr,initIndex & 0xffffffff,aValue,4);
      }
      else {
        ((ThreadContext *)local_70)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
        (*(pTVar7->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x70])(pTVar7,initIndex & 0xffffffff,aValue);
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
LAB_00b8f51f:
        *(bool *)((long)local_70 + 0x108) = true;
      }
      initIndex = (ulong)((uint32)initIndex + 1);
      uVar3 = initIndex;
    }
    BigIndex::BigIndex((BigIndex *)local_88,0xffffffff);
    if (0xffffffff < (long)jsReentLock._24_8_) {
      dstIndex.bigIndex = __tls_get_addr(&PTR_0155fe48);
      do {
        if (pArr == (JavascriptArray *)0x0) {
          *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          if (uVar11 - 0x80000000 < 0xffffffff00000000) {
            dVar12 = (double)(long)uVar11;
            uVar9 = NumberUtilities::ToSpecial(dVar12);
            bVar4 = NumberUtilities::IsNan(dVar12);
            if (((bVar4) &&
                (uVar10 = NumberUtilities::ToSpecial(dVar12), uVar10 != 0xfff8000000000000)) &&
               (uVar10 = NumberUtilities::ToSpecial(dVar12), uVar10 != 0x7ff8000000000000)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *(undefined4 *)dstIndex.bigIndex = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar4) goto LAB_00b8f8a8;
              *(undefined4 *)dstIndex.bigIndex = 0;
            }
            pvVar8 = (Var)(uVar9 ^ 0xfffc000000000000);
          }
          else {
            pvVar8 = (Var)(uVar11 & 0xffffffff | 0x1000000000000);
          }
          JavascriptOperators::OP_SetElementI
                    (obj,pvVar8,aValue,scriptContext,PropertyOperation_ThrowIfNotExtensible);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          *(bool *)((long)local_70 + 0x108) = true;
        }
        else {
          BigIndex::SetItem((BigIndex *)local_88,pArr,aValue);
          if (local_88._0_4_ == 0xffffffff) {
            dstIndex._0_8_ = dstIndex._0_8_ + 1;
          }
          else {
            local_88._0_4_ = local_88._0_4_ + 1;
          }
        }
        uVar11 = uVar11 + 1;
      } while (jsReentLock._24_8_ != uVar11);
    }
  }
  else {
    BigIndex::BigIndex((BigIndex *)local_88,initIndex);
    if ((long)initIndex < (long)jsReentLock._24_8_) {
      dstIndex.bigIndex = __tls_get_addr(&PTR_0155fe48);
      do {
        if (pArr == (JavascriptArray *)0x0) {
          *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          if (initIndex - 0x80000000 < 0xffffffff00000000) {
            dVar12 = (double)(long)initIndex;
            uVar9 = NumberUtilities::ToSpecial(dVar12);
            bVar4 = NumberUtilities::IsNan(dVar12);
            if (((bVar4) &&
                (uVar10 = NumberUtilities::ToSpecial(dVar12), uVar10 != 0xfff8000000000000)) &&
               (uVar10 = NumberUtilities::ToSpecial(dVar12), uVar10 != 0x7ff8000000000000)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *(undefined4 *)dstIndex.bigIndex = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar4) goto LAB_00b8f8a8;
              *(undefined4 *)dstIndex.bigIndex = 0;
            }
            pvVar8 = (Var)(uVar9 ^ 0xfffc000000000000);
          }
          else {
            pvVar8 = (Var)(initIndex & 0xffffffff | 0x1000000000000);
          }
          JavascriptOperators::OP_SetElementI
                    (obj,pvVar8,aValue,scriptContext,PropertyOperation_ThrowIfNotExtensible);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          *(bool *)((long)local_70 + 0x108) = true;
        }
        else {
          BigIndex::SetItem((BigIndex *)local_88,pArr,aValue);
          if (local_88._0_4_ == 0xffffffff) {
            dstIndex._0_8_ = dstIndex._0_8_ + 1;
          }
          else {
            local_88._0_4_ = local_88._0_4_ + 1;
          }
        }
        initIndex = initIndex + 1;
      } while (jsReentLock._24_8_ != initIndex);
    }
  }
  *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return obj;
}

Assistant:

Var JavascriptArray::FillHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        Assert(args.Info.Count > 0);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;

        // If we came from Array.prototype.fill and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var fillValue;

        if (args.Info.Count > 1)
        {
            fillValue = args[1];
            if (isTypedArrayEntryPoint)
            {
                JS_REENTRANT_UNLOCK(jsReentLock, fillValue = JavascriptNumber::ToVarNoCheck(JavascriptConversion::ToNumber(fillValue, scriptContext), scriptContext));
            }
        }
        else
        {
            fillValue = library->GetUndefined();
        }

        int64 k = 0;
        int64 finalVal = length;

        if (args.Info.Count > 2)
        {
            JS_REENTRANT_UNLOCK(jsReentLock, k = JavascriptArray::GetIndexFromVar(args[2], length, scriptContext));

            if (args.Info.Count > 3 && !JavascriptOperators::IsUndefinedObject(args[3]))
            {
                JS_REENTRANT_UNLOCK(jsReentLock, finalVal = JavascriptArray::GetIndexFromVar(args[3], length, scriptContext));
            }

            // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
            // we will process the array elements like an ES5Array.
            if (pArr && !JavascriptArray::IsNonES5Array(obj))
            {
                AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                pArr = nullptr;
            }
        }

        if (k < MaxArrayLength)
        {
            int64 end = min<int64>(finalVal, MaxArrayLength);
            uint32 u32k = static_cast<uint32>(k);

            while (u32k < end)
            {
                if (typedArrayBase)
                {
                    JS_REENTRANT(jsReentLock, typedArrayBase->DirectSetItem(u32k, fillValue));
                }
                else if (pArr)
                {
                    pArr->SetItem(u32k, fillValue, PropertyOperation_ThrowIfNotExtensible);
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI_UInt32(obj, u32k, fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }

                u32k++;
            }

            BigIndex dstIndex = MaxArrayLength;

            for (int64 i = end; i < finalVal; ++i)
            {
                if (pArr)
                {
                    pArr->GenericDirectSetItemAt(dstIndex, fillValue);
                    ++dstIndex;
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI(obj, JavascriptNumber::ToVar(i, scriptContext), fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }
            }
        }
        else
        {
            BigIndex dstIndex = static_cast<uint64>(k);

            for (int64 i = k; i < finalVal; i++)
            {
                if (pArr)
                {
                    pArr->GenericDirectSetItemAt(dstIndex, fillValue);
                    ++dstIndex;
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI(obj, JavascriptNumber::ToVar(i, scriptContext), fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }
            }
        }

        return obj;
    }